

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gzgetc(gzFile file)

{
  byte *pbVar1;
  z_size_t zVar2;
  uint local_2c;
  gz_statep state;
  uchar buf [1];
  gzFile pgStack_18;
  int ret;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = 0xffffffff;
  }
  else if ((file[1].have == 0x1c4f) &&
          ((*(int *)((long)&file[4].next + 4) == 0 || (*(int *)((long)&file[4].next + 4) == -5)))) {
    if (file->have == 0) {
      pgStack_18 = file;
      zVar2 = gz_read((gz_statep)file,(voidp)((long)&state + 3),1);
      if ((int)zVar2 < 1) {
        local_2c = 0xffffffff;
      }
      else {
        local_2c = (uint)state._3_1_;
      }
      file_local._4_4_ = local_2c;
    }
    else {
      file->have = file->have - 1;
      file->pos = file->pos + 1;
      pbVar1 = file->next;
      file->next = pbVar1 + 1;
      file_local._4_4_ = (uint)*pbVar1;
    }
  }
  else {
    file_local._4_4_ = 0xffffffff;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzgetc(file)
    gzFile file;
{
    int ret;
    unsigned char buf[1];
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
        (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* try output buffer (no need to check for skip request) */
    if (state->x.have) {
        state->x.have--;
        state->x.pos++;
        return *(state->x.next)++;
    }

    /* nothing there -- try gz_read() */
    ret = gz_read(state, buf, 1);
    return ret < 1 ? -1 : buf[0];
}